

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000022f0a0 = 0x2d2d2d2d2d2d2d;
    uRam000000000022f0a7._0_1_ = '-';
    uRam000000000022f0a7._1_1_ = '-';
    uRam000000000022f0a7._2_1_ = '-';
    uRam000000000022f0a7._3_1_ = '-';
    uRam000000000022f0a7._4_1_ = '-';
    uRam000000000022f0a7._5_1_ = '-';
    uRam000000000022f0a7._6_1_ = '-';
    uRam000000000022f0a7._7_1_ = '-';
    DAT_0022f090 = '-';
    DAT_0022f090_1._0_1_ = '-';
    DAT_0022f090_1._1_1_ = '-';
    DAT_0022f090_1._2_1_ = '-';
    DAT_0022f090_1._3_1_ = '-';
    DAT_0022f090_1._4_1_ = '-';
    DAT_0022f090_1._5_1_ = '-';
    DAT_0022f090_1._6_1_ = '-';
    uRam000000000022f098 = 0x2d2d2d2d2d2d2d;
    DAT_0022f09f = 0x2d;
    DAT_0022f080 = '-';
    DAT_0022f080_1._0_1_ = '-';
    DAT_0022f080_1._1_1_ = '-';
    DAT_0022f080_1._2_1_ = '-';
    DAT_0022f080_1._3_1_ = '-';
    DAT_0022f080_1._4_1_ = '-';
    DAT_0022f080_1._5_1_ = '-';
    DAT_0022f080_1._6_1_ = '-';
    uRam000000000022f088._0_1_ = '-';
    uRam000000000022f088._1_1_ = '-';
    uRam000000000022f088._2_1_ = '-';
    uRam000000000022f088._3_1_ = '-';
    uRam000000000022f088._4_1_ = '-';
    uRam000000000022f088._5_1_ = '-';
    uRam000000000022f088._6_1_ = '-';
    uRam000000000022f088._7_1_ = '-';
    DAT_0022f070 = '-';
    DAT_0022f070_1._0_1_ = '-';
    DAT_0022f070_1._1_1_ = '-';
    DAT_0022f070_1._2_1_ = '-';
    DAT_0022f070_1._3_1_ = '-';
    DAT_0022f070_1._4_1_ = '-';
    DAT_0022f070_1._5_1_ = '-';
    DAT_0022f070_1._6_1_ = '-';
    uRam000000000022f078._0_1_ = '-';
    uRam000000000022f078._1_1_ = '-';
    uRam000000000022f078._2_1_ = '-';
    uRam000000000022f078._3_1_ = '-';
    uRam000000000022f078._4_1_ = '-';
    uRam000000000022f078._5_1_ = '-';
    uRam000000000022f078._6_1_ = '-';
    uRam000000000022f078._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000022f068._0_1_ = '-';
    uRam000000000022f068._1_1_ = '-';
    uRam000000000022f068._2_1_ = '-';
    uRam000000000022f068._3_1_ = '-';
    uRam000000000022f068._4_1_ = '-';
    uRam000000000022f068._5_1_ = '-';
    uRam000000000022f068._6_1_ = '-';
    uRam000000000022f068._7_1_ = '-';
    DAT_0022f0af = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}